

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder_suite.cpp
# Opt level: O0

void literal_suite::test_string(void)

{
  string local_1f8 [36];
  undefined4 local_1d4;
  basic_string_view<char,_std::char_traits<char>_> local_1d0;
  size_type local_1c0 [3];
  undefined1 local_1a8 [8];
  encoder_type encoder;
  ostringstream local_180 [8];
  ostringstream result;
  
  std::__cxx11::ostringstream::ostringstream(local_180);
  trial::protocol::json::detail::basic_encoder<char,24ul>::
  basic_encoder<std::__cxx11::ostringstream>
            ((basic_encoder<char,24ul> *)local_1a8,
             (basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_1d0,"alpha");
  local_1c0[0] = trial::protocol::json::detail::basic_encoder<char,_24UL>::literal
                           ((basic_encoder<char,_24UL> *)local_1a8,&local_1d0);
  local_1d4 = 5;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("encoder.literal(\"alpha\")","5",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3e5,"void literal_suite::test_string()",local_1c0,&local_1d4);
  std::__cxx11::ostringstream::str();
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("result.str()","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/encoder_suite.cpp"
             ,0x3e6,"void literal_suite::test_string()",local_1f8,"alpha");
  std::__cxx11::string::~string(local_1f8);
  trial::protocol::json::detail::basic_encoder<char,_24UL>::~basic_encoder
            ((basic_encoder<char,_24UL> *)local_1a8);
  std::__cxx11::ostringstream::~ostringstream(local_180);
  return;
}

Assistant:

void test_string()
{
    std::ostringstream result;
    encoder_type encoder(result);
    TRIAL_PROTOCOL_TEST_EQUAL(encoder.literal("alpha"), 5);
    TRIAL_PROTOCOL_TEST_EQUAL(result.str(), "alpha");
}